

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O2

Abc_Obj_t * Io_ReadCreatePo(Abc_Ntk_t *pNtk,char *pName)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pObj;
  
  pAVar1 = Abc_NtkFindNet(pNtk,pName);
  if ((pAVar1 != (Abc_Obj_t *)0x0) && ((pAVar1->vFanins).nSize == 0)) {
    printf("Warning: PO \"%s\" appears twice in the list.\n",pName);
  }
  pAVar1 = Abc_NtkFindOrCreateNet(pNtk,pName);
  pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
  Abc_ObjAddFanin(pObj,pAVar1);
  return pObj;
}

Assistant:

Abc_Obj_t * Io_ReadCreatePo( Abc_Ntk_t * pNtk, char * pName )
{
    Abc_Obj_t * pNet, * pTerm;
    // get the PO net
    pNet  = Abc_NtkFindNet( pNtk, pName );
    if ( pNet && Abc_ObjFaninNum(pNet) == 0 )
        printf( "Warning: PO \"%s\" appears twice in the list.\n", pName );
    pNet  = Abc_NtkFindOrCreateNet( pNtk, pName );
    // add the PO node
    pTerm = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pTerm, pNet );
    return pTerm;
}